

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.hpp
# Opt level: O0

void __thiscall BSDF::BSDF(BSDF *this,Json *conf)

{
  bool bVar1;
  value_t vVar2;
  const_reference pvVar3;
  void *pvVar4;
  string *s;
  undefined8 *in_RDI;
  vec3f vVar5;
  string *in_stack_fffffffffffffd48;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffd50;
  const_reference in_stack_fffffffffffffd60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  string *in_stack_fffffffffffffd98;
  ScalarImage *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffda8;
  Image *in_stack_fffffffffffffdb0;
  string local_248 [16];
  char *in_stack_fffffffffffffdc8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffdd0;
  string local_1e0 [32];
  string local_1c0 [96];
  vec3f local_160;
  undefined8 local_150;
  float local_148;
  undefined1 local_141;
  string local_140 [32];
  string local_120 [96];
  vec3f local_c0;
  undefined8 local_ac;
  float local_a4;
  undefined1 local_9d;
  string local_90 [32];
  string local_70 [112];
  
  *in_RDI = &PTR___cxa_pure_virtual_001e8228;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  vec3f::vec3f((vec3f *)(in_RDI + 3),1.0);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[3]>(in_stack_fffffffffffffd68,(char (*) [3])in_stack_fffffffffffffd60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)in_stack_fffffffffffffd48);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(in_stack_fffffffffffffd50,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)in_stack_fffffffffffffd48);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    vVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::type(pvVar3);
    if (vVar2 == string) {
      pvVar4 = operator_new(0x10);
      local_9d = 1;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_fffffffffffffd48);
      getpath(in_stack_fffffffffffffd48);
      Image::Image(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_9d = 0;
      in_RDI[1] = pvVar4;
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
    }
    else {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      vVar5 = json2vec3f((Json *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
      local_c0._0_8_ = vVar5._0_8_;
      local_ac._0_4_ = local_c0.x;
      local_ac._4_4_ = local_c0.y;
      local_c0.z = vVar5.z;
      local_a4 = local_c0.z;
      in_RDI[3] = local_c0._0_8_;
      *(float *)(in_RDI + 4) = local_c0.z;
      local_c0 = vVar5;
    }
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[7]>(in_stack_fffffffffffffd68,(char (*) [7])in_stack_fffffffffffffd60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)in_stack_fffffffffffffd48);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(in_stack_fffffffffffffd50,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)in_stack_fffffffffffffd48);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    vVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::type(pvVar3);
    if (vVar2 == string) {
      in_stack_fffffffffffffd68 =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)operator_new(0x10);
      local_141 = 1;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_fffffffffffffd48);
      getpath(in_stack_fffffffffffffd48);
      Image::Image(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_141 = 0;
      in_RDI[1] = in_stack_fffffffffffffd68;
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_140);
    }
    else {
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      vVar5 = json2vec3f((Json *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
      local_160._0_8_ = vVar5._0_8_;
      local_150._0_4_ = local_160.x;
      local_150._4_4_ = local_160.y;
      local_160.z = vVar5.z;
      local_148 = local_160.z;
      in_RDI[3] = local_160._0_8_;
      *(float *)(in_RDI + 4) = local_160.z;
      local_160 = vVar5;
    }
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[5]>(in_stack_fffffffffffffd68,(char (*) [5])in_stack_fffffffffffffd60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)in_stack_fffffffffffffd48);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(in_stack_fffffffffffffd50,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)in_stack_fffffffffffffd48);
  if (bVar1) {
    pvVar4 = operator_new(0x10);
    in_stack_fffffffffffffd60 =
         nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::operator[]<char_const>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_fffffffffffffd48);
    getpath(in_stack_fffffffffffffd48);
    ScalarImage::ScalarImage(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    in_RDI[2] = pvVar4;
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_1e0);
  }
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::find<char_const(&)[8]>(in_stack_fffffffffffffd68,(char (*) [8])in_stack_fffffffffffffd60);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         *)in_stack_fffffffffffffd48);
  bVar1 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator!=(in_stack_fffffffffffffd50,
                       (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)in_stack_fffffffffffffd48);
  if (bVar1) {
    s = (string *)operator_new(0x10);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)s);
    getpath(s);
    ScalarImage::ScalarImage(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    in_RDI[2] = s;
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
  }
  return;
}

Assistant:

BSDF(const Json& conf)
	{
		if (conf.find("Kd") != conf.end())
		{
			if (conf["Kd"].type() == Json::value_t::string)
				albedoTexture = new Image(getpath(conf["Kd"]));
			else
				albedoConst = json2vec3f(conf["Kd"]);
		}
		if (conf.find("albedo") != conf.end())
		{
			if (conf["albedo"].type() == Json::value_t::string)
				albedoTexture = new Image(getpath(conf["albedo"]));
			else
				albedoConst = json2vec3f(conf["albedo"]);
		}
		if (conf.find("bump") != conf.end())
		{
			bumpTexture = new ScalarImage(getpath(conf["bump"]));
		}
		if (conf.find("bumpmap") != conf.end())
		{
			bumpTexture = new ScalarImage(getpath(conf["bumpmap"]));
		}
	}